

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O3

void test_bson_as_json_dbpointer(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *__s;
  size_t sVar5;
  ushort **ppuVar6;
  char *unaff_R12;
  long lVar7;
  char *unaff_R15;
  bson_oid_t oid;
  size_t len;
  undefined1 auStack_68 [12];
  undefined1 auStack_5c [12];
  undefined8 uStack_50;
  undefined1 local_24 [12];
  undefined1 local_18 [8];
  
  bson_oid_init_from_string(local_24,"12341234123412abcdababcd");
  uVar3 = bson_new();
  cVar1 = bson_append_dbpointer(uVar3,"dbpointer",0xffffffff,"collection",local_24);
  if (cVar1 == '\0') {
    test_bson_as_json_dbpointer_cold_1();
  }
  else {
    cVar1 = bson_append_dbpointer(uVar3,"escaping",0xffffffff,"\"coll\"",local_24);
    if (cVar1 != '\0') {
      pcVar4 = (char *)bson_as_json(uVar3,local_18);
      if (pcVar4 == 
          "{ \"dbpointer\" : { \"$ref\" : \"collection\", \"$id\" : \"12341234123412abcdababcd\" }, \"escaping\" : { \"$ref\" : \"\\\"coll\\\"\", \"$id\" : \"12341234123412abcdababcd\" } }"
         ) {
LAB_0012d8bf:
        bson_free(pcVar4);
        bson_destroy(uVar3);
        return;
      }
      iVar2 = strcmp(pcVar4,
                     "{ \"dbpointer\" : { \"$ref\" : \"collection\", \"$id\" : \"12341234123412abcdababcd\" }, \"escaping\" : { \"$ref\" : \"\\\"coll\\\"\", \"$id\" : \"12341234123412abcdababcd\" } }"
                    );
      if (iVar2 == 0) goto LAB_0012d8bf;
      goto LAB_0012d8e1;
    }
  }
  test_bson_as_json_dbpointer_cold_2();
LAB_0012d8e1:
  test_bson_as_json_dbpointer_cold_3();
  uStack_50 = uVar3;
  bson_oid_init_from_string(auStack_5c,"12341234123412abcdababcd");
  uVar3 = bson_new();
  cVar1 = bson_append_dbpointer(uVar3,"p",1,"coll",auStack_5c);
  if (cVar1 == '\0') {
    test_bson_as_canonical_extended_json_dbpointer_cold_1();
  }
  else {
    __s = (char *)bson_as_canonical_extended_json(uVar3,auStack_68);
    sVar5 = strlen(__s);
    unaff_R15 = (char *)bson_malloc0(sVar5 + 1);
    unaff_R12 = (char *)bson_malloc0(0x62);
    lVar7 = 0;
    ppuVar6 = __ctype_b_loc();
    pcVar4 = __s;
    do {
      do {
        cVar1 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while ((*(byte *)((long)*ppuVar6 + (long)cVar1 * 2 + 1) & 0x20) != 0);
      unaff_R15[lVar7] = cVar1;
      lVar7 = lVar7 + 1;
    } while (*pcVar4 != '\0');
    pcVar4 = 
    "{ \"p\" : { \"$dbPointer\" : { \"$ref\" : \"coll\", \"$id\" : { \"$oid\" : \"12341234123412abcdababcd\" } } } }"
    ;
    lVar7 = 0;
    do {
      do {
        cVar1 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while ((*(byte *)((long)*ppuVar6 + (long)cVar1 * 2 + 1) & 0x20) != 0);
      unaff_R12[lVar7] = cVar1;
      lVar7 = lVar7 + 1;
    } while (*pcVar4 != '\0');
    iVar2 = strcmp(unaff_R15,unaff_R12);
    if (iVar2 == 0) {
      bson_free(unaff_R15);
      bson_free(unaff_R12);
      bson_free(__s);
      bson_destroy(uVar3);
      return;
    }
  }
  fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n%s:%d  %s()\n",unaff_R15,unaff_R12,
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          0x284,"test_bson_as_canonical_extended_json_dbpointer");
  abort();
}

Assistant:

static void
test_bson_as_json_dbpointer (void)
{
   bson_oid_t oid;
   bson_t *b;
   char *str;
   size_t len;

   bson_oid_init_from_string (&oid, "12341234123412abcdababcd");

   b = bson_new ();
   BSON_ASSERT (bson_append_dbpointer (b, "dbpointer", -1, "collection", &oid));
   BSON_ASSERT (bson_append_dbpointer (b, "escaping", -1, "\"coll\"", &oid));
   str = bson_as_json (b, &len);

   ASSERT_CMPSTR (str,
                  "{"
                  " \"dbpointer\" : { \"$ref\" : \"collection\", \"$id\" "
                  ": \"12341234123412abcdababcd\" },"
                  " \"escaping\" : { \"$ref\" : \"\\\"coll\\\"\", \"$id\" "
                  ": \"12341234123412abcdababcd\" } }");

   bson_free (str);
   bson_destroy (b);
}